

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
MultivariateTracker::MultivariateTracker
          (MultivariateTracker *this,long size,StatisticsTrackerOptions *options)

{
  undefined3 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  allocator<double> local_29;
  value_type_conflict3 local_28;
  StatisticsTrackerOptions *local_20;
  StatisticsTrackerOptions *options_local;
  long size_local;
  MultivariateTracker *this_local;
  
  local_28 = 0.0;
  local_20 = options;
  options_local = (StatisticsTrackerOptions *)size;
  size_local = (long)this;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->_covariance,size * size,&local_28,&local_29);
  std::allocator<double>::~allocator(&local_29);
  uVar1 = *(undefined3 *)&(local_20->histogramOptions).field_0x9;
  (this->_options).histogramOptions.enabled = (local_20->histogramOptions).enabled;
  *(undefined3 *)&(this->_options).histogramOptions.field_0x9 = uVar1;
  bVar2 = local_20->doMax;
  bVar3 = local_20->doMean;
  bVar4 = local_20->doMin;
  bVar5 = local_20->doVar;
  uVar1 = *(undefined3 *)&local_20->field_0x5;
  iVar6 = (local_20->histogramOptions).binCount;
  iVar7 = (local_20->histogramOptions).cacheSize;
  (this->_options).doCov = local_20->doCov;
  (this->_options).doMax = bVar2;
  (this->_options).doMean = bVar3;
  (this->_options).doMin = bVar4;
  (this->_options).doVar = bVar5;
  *(undefined3 *)&(this->_options).field_0x5 = uVar1;
  (this->_options).histogramOptions.binCount = iVar6;
  (this->_options).histogramOptions.cacheSize = iVar7;
  std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::vector(&this->_statistics);
  initialize(this,(long)options_local,local_20);
  return;
}

Assistant:

MultivariateTracker(long size = 0,
                        StatisticsTrackerOptions const & options = StatisticsTrackerOptions()) :
        _covariance(std::vector<double>(size*size,0)),
        _options(options)
    {
        this->initialize(size, options);
    }